

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

int UTF_uj16_cmp(UTF_UC16 *uj16a,UTF_UC16 *uj16b)

{
  bool bVar1;
  UTF_UC16 *local_20;
  UTF_UC16 *uj16b_local;
  UTF_UC16 *uj16a_local;
  
  local_20 = uj16b;
  uj16b_local = uj16a;
  while( true ) {
    bVar1 = false;
    if (*uj16b_local != L'\0') {
      bVar1 = *local_20 != L'\0';
    }
    if (!bVar1) {
      if ((ushort)*uj16b_local < (ushort)*local_20) {
        return -1;
      }
      if ((ushort)*local_20 < (ushort)*uj16b_local) {
        return 1;
      }
      return 0;
    }
    if ((ushort)*uj16b_local < (ushort)*local_20) {
      return -1;
    }
    if ((ushort)*local_20 < (ushort)*uj16b_local) break;
    uj16b_local = uj16b_local + 1;
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

static __inline int
UTF_uj16_cmp(const UTF_UC16 *uj16a, const UTF_UC16 *uj16b)
{
    while (*uj16a && *uj16b)
    {
        if (*uj16a < *uj16b) return -1;
        if (*uj16a > *uj16b) return 1;
        ++uj16a;
        ++uj16b;
    }
    if (*uj16a < *uj16b) return -1;
    if (*uj16a > *uj16b) return 1;
    return 0;
}